

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O3

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined4 in_register_00000034;
  FileWriter *pFVar3;
  string path;
  ofstream of;
  string local_240;
  FileWriter local_220 [6];
  ios_base local_128 [264];
  
  buildPath(&local_240,this,(string *)CONCAT44(in_register_00000034,__fd));
  bVar1 = tryWrite(this,&local_240);
  if (bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::ofstream::ofstream(local_220,(string *)&local_240,_S_out);
    pFVar3 = local_220;
    nlohmann::operator<<
              ((ostream *)pFVar3,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)__buf);
    logTime(pFVar3,(Timer *)__n);
    local_220[0].prefix_._M_dataplus._M_p = _VTT;
    *(undefined8 *)((long)&local_220[0].prefix_._M_dataplus._M_p + *(long *)(_VTT + -0x18)) =
         _xsgetn;
    std::filebuf::~filebuf(&local_220[0].prefix_._M_string_length);
    std::ios_base::~ios_base(local_128);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Skipping (file exists): ",0x18);
    pFVar3 = (FileWriter *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,local_240._M_dataplus._M_p,local_240._M_string_length);
    logTime(pFVar3,(Timer *)__n);
  }
  paVar2 = &local_240.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    paVar2 = extraout_RAX;
  }
  return (ssize_t)paVar2;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const nlohmann::json& json,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  std::ofstream of(path);
  of << json;
  logTime(t);
}